

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressionSize.c
# Opt level: O0

int DoCompressionTest(IceTEnum color_format,IceTEnum depth_format,IceTEnum composite_mode)

{
  int iVar1;
  IceTSizeType IVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *buffer;
  IceTImage image_00;
  IceTSparseImage compressed_image;
  int local_80;
  int result;
  IceTSizeType size;
  IceTSizeType pixel_size;
  IceTSizeType depth_pixel_size;
  IceTSizeType color_pixel_size;
  IceTSizeType compressedsize;
  IceTVoid *interlacedbuffer;
  IceTSparseImage interlacedimage;
  IceTVoid *compressedbuffer;
  IceTSparseImage compressedimage;
  IceTSizeType imagesize;
  IceTVoid *imagebuffer;
  IceTImage image;
  IceTInt local_28;
  IceTSizeType pixels;
  IceTInt viewport [4];
  IceTEnum composite_mode_local;
  IceTEnum depth_format_local;
  IceTEnum color_format_local;
  
  local_80 = 0;
  viewport[3] = composite_mode;
  printf("Using color format of 0x%x\n",(ulong)color_format);
  printf("Using depth format of 0x%x\n",(ulong)depth_format);
  printf("Using composite mode of 0x%x\n",(ulong)(uint)viewport[3]);
  icetSetColorFormat(color_format);
  icetSetDepthFormat(depth_format);
  icetCompositeMode(viewport[3]);
  iVar1 = SCREEN_WIDTH * SCREEN_HEIGHT;
  printf("Allocating memory for %dx%d pixel image.\n",(ulong)(uint)SCREEN_WIDTH,
         (ulong)(uint)SCREEN_HEIGHT);
  IVar2 = icetImageBufferSize(SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer = malloc((long)IVar2);
  image_00 = icetImageAssignBuffer(buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
  depth_pixel_size = icetSparseImageBufferSize(SCREEN_WIDTH,SCREEN_HEIGHT);
  interlacedimage.opaque_internals = malloc((long)depth_pixel_size);
  compressed_image =
       icetSparseImageAssignBuffer(interlacedimage.opaque_internals,SCREEN_WIDTH,SCREEN_HEIGHT);
  _color_pixel_size = malloc((long)depth_pixel_size);
  interlacedbuffer =
       (IceTVoid *)icetSparseImageAssignBuffer(_color_pixel_size,SCREEN_WIDTH,SCREEN_HEIGHT);
  icetImageGetColorVoid(image_00,&pixel_size);
  icetImageGetDepthVoid(image_00,&size);
  uVar3 = pixel_size + size;
  printf("Pixel size: color=%d, depth=%d, total=%d\n",(ulong)(uint)pixel_size,(ulong)(uint)size,
         (ulong)uVar3);
  printf("\nCreating worst possible image (with respect to compression).\n");
  InitPathologicalImage(image_00);
  printf("Compressing image.\n");
  icetCompressImage(image_00,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)(uVar3 * (iVar1 / 2) + (iVar1 / 2) * 4),
         (ulong)uVar4);
  if (depth_pixel_size < (int)uVar4) {
LAB_00105ec7:
    printf("*** Size differs from expected size!\n");
    local_80 = -3;
  }
  else if ((int)uVar4 < (int)(uVar3 * (iVar1 / 2))) goto LAB_00105ec7;
  printf("Interlacing image.\n");
  icetSparseImageInterlace(compressed_image,0x61,0x1b0,(IceTSparseImage)interlacedbuffer);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)(uVar3 * (iVar1 / 2) + (iVar1 / 2) * 4),
         (ulong)uVar4);
  if (depth_pixel_size < (int)uVar4) {
LAB_00105f94:
    printf("*** Size differs from expected size!\n");
    local_80 = -3;
  }
  else if ((int)uVar4 < (int)(uVar3 * (iVar1 / 2))) goto LAB_00105f94;
  printf("\nCreating a different worst possible image.\n");
  InitActiveImage(image_00);
  printf("Compressing image.\n");
  icetCompressImage(image_00,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)(uint)depth_pixel_size,(ulong)uVar4);
  if ((depth_pixel_size < (int)uVar4) || ((int)uVar4 < (int)(uVar3 * iVar1))) {
    printf("*** Size differs from expected size!\n");
    local_80 = -3;
  }
  printf("Interlacing image.\n");
  icetSparseImageInterlace(compressed_image,0x61,0x1b0,(IceTSparseImage)interlacedbuffer);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)(uVar3 * (iVar1 / 2) + (iVar1 / 2) * 4),
         (ulong)uVar4);
  if ((int)uVar4 <= depth_pixel_size) {
    if ((int)(uVar3 * (iVar1 / 2)) <= (int)uVar4) goto LAB_001060f3;
  }
  printf("*** Size differs from expected size!\n");
  local_80 = -3;
LAB_001060f3:
  printf("\nCompressing zero size image.\n");
  icetImageSetDimensions(image_00,0,0);
  icetCompressImage(image_00,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  uVar5 = icetSparseImageBufferSize(0,0);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar5,(ulong)uVar4);
  IVar2 = icetSparseImageBufferSize(0,0);
  if (IVar2 < (int)uVar4) {
    printf("*** Size differs from expected size!\n");
    local_80 = -3;
  }
  printf("\nSetup for actual render.\n");
  icetResetTiles();
  icetAddTile(0,0,SCREEN_WIDTH,SCREEN_HEIGHT,0);
  icetDrawCallback(drawCallback);
  icetDrawFrame(IdentityMatrix,IdentityMatrix,Black);
  pixels = 0;
  local_28 = 0;
  viewport[0] = SCREEN_WIDTH;
  viewport[1] = SCREEN_HEIGHT;
  icetStateSetIntegerv(0x83,4,&local_28);
  printf("Now render and get compressed image.\n");
  icetGetCompressedTileImage(0,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)(uint)depth_pixel_size,(ulong)uVar4);
  if ((depth_pixel_size < (int)uVar4) || ((int)uVar4 < (int)(uVar3 * iVar1))) {
    printf("*** Size differs from expected size!\n");
    local_80 = -3;
  }
  printf("Cleaning up.\n");
  free(buffer);
  free(interlacedimage.opaque_internals);
  free(_color_pixel_size);
  return local_80;
}

Assistant:

static int DoCompressionTest(IceTEnum color_format, IceTEnum depth_format,
                             IceTEnum composite_mode)
{
    IceTInt viewport[4];
    IceTSizeType pixels;
    IceTImage image;
    IceTVoid *imagebuffer;
    IceTSizeType imagesize;
    IceTSparseImage compressedimage;
    IceTVoid *compressedbuffer;
    IceTSparseImage interlacedimage;
    IceTVoid *interlacedbuffer;
    IceTSizeType compressedsize;
    IceTSizeType color_pixel_size;
    IceTSizeType depth_pixel_size;
    IceTSizeType pixel_size;
    IceTSizeType size;
    int result;

    result = TEST_PASSED;

    printf("Using color format of 0x%x\n", (int)color_format);
    printf("Using depth format of 0x%x\n", (int)depth_format);
    printf("Using composite mode of 0x%x\n", (int)composite_mode);

    icetSetColorFormat(color_format);
    icetSetDepthFormat(depth_format);
    icetCompositeMode(composite_mode);

    pixels = SCREEN_WIDTH*SCREEN_HEIGHT;

    printf("Allocating memory for %dx%d pixel image.\n",
           (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
    imagesize = icetImageBufferSize(SCREEN_WIDTH, SCREEN_HEIGHT);
    imagebuffer = malloc(imagesize);
    image = icetImageAssignBuffer(imagebuffer, SCREEN_WIDTH, SCREEN_HEIGHT);

    compressedsize = icetSparseImageBufferSize(SCREEN_WIDTH, SCREEN_HEIGHT);
    compressedbuffer = malloc(compressedsize);
    compressedimage = icetSparseImageAssignBuffer(compressedbuffer,
                                                  SCREEN_WIDTH,
                                                  SCREEN_HEIGHT);

    interlacedbuffer = malloc(compressedsize);
    interlacedimage = icetSparseImageAssignBuffer(interlacedbuffer,
                                                  SCREEN_WIDTH,
                                                  SCREEN_HEIGHT);

  /* Get the number of bytes per pixel.  This is used in checking the
     size of compressed images. */
    icetImageGetColorVoid(image, &color_pixel_size);
    icetImageGetDepthVoid(image, &depth_pixel_size);
    pixel_size = color_pixel_size + depth_pixel_size;
    printf("Pixel size: color=%d, depth=%d, total=%d\n",
           (int)color_pixel_size, (int)depth_pixel_size, (int)pixel_size);

    printf("\nCreating worst possible image (with respect to compression).\n");
    InitPathologicalImage(image);

    printf("Compressing image.\n");
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Interlacing image.\n");
    icetSparseImageInterlace(compressedimage,
                             97,
                             ICET_SI_STRATEGY_BUFFER_0,
                             interlacedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("\nCreating a different worst possible image.\n");
    InitActiveImage(image);
    printf("Compressing image.\n");
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)compressedsize, (int)size);
    if ((size > compressedsize) || (size < pixel_size*pixels)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Interlacing image.\n");
    icetSparseImageInterlace(compressedimage,
                             97,
                             ICET_SI_STRATEGY_BUFFER_0,
                             interlacedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("\nCompressing zero size image.\n");
    icetImageSetDimensions(image, 0, 0);
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)icetSparseImageBufferSize(0, 0), (int)size);
    if (size > icetSparseImageBufferSize(0, 0)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

  /* This test can be a little volatile.  The icetGetCompressedTileImage
   * expects certain things to be set correctly by the icetDrawFrame
   * function.  Since we want to call icetGetCompressedTileImage directly,
   * we try to set up these parameters by hand.  It is possible for this
   * test to incorrectly fail if the two functions are mutually changed and
   * this scaffolding is not updated correctly. */
    printf("\nSetup for actual render.\n");
    icetResetTiles();
    icetAddTile(0, 0, SCREEN_WIDTH, SCREEN_HEIGHT, 0);
    icetDrawCallback(drawCallback);
  /* Do a perfunctory draw to set other state variables. */
    icetDrawFrame(IdentityMatrix, IdentityMatrix, Black);
    viewport[0] = viewport[1] = 0;
    viewport[2] = (IceTInt)SCREEN_WIDTH;  viewport[3] = (IceTInt)SCREEN_HEIGHT;
    icetStateSetIntegerv(ICET_CONTAINED_VIEWPORT, 4, viewport);
    printf("Now render and get compressed image.\n");
    icetGetCompressedTileImage(0, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)compressedsize, (int)size);
    if ((size > compressedsize) || (size < pixel_size*pixels)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Cleaning up.\n");
    free(imagebuffer);
    free(compressedbuffer);
    free(interlacedbuffer);
    return result;
}